

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionmenuitems.h
# Opt level: O0

void __thiscall
FOptionMenuFieldBase::FOptionMenuFieldBase
          (FOptionMenuFieldBase *this,char *label,char *menu,char *graycheck)

{
  char *var_name;
  FBaseCVar *pFVar1;
  size_t sVar2;
  FBaseCVar *local_88;
  FName local_2c;
  char *local_28;
  char *graycheck_local;
  char *menu_local;
  char *label_local;
  FOptionMenuFieldBase *this_local;
  
  local_28 = graycheck;
  graycheck_local = menu;
  menu_local = label;
  label_local = (char *)this;
  FName::FName(&local_2c,menu);
  FOptionMenuItem::FOptionMenuItem(&this->super_FOptionMenuItem,label,&local_2c,false);
  (this->super_FOptionMenuItem).super_FListMenuItem._vptr_FListMenuItem =
       (_func_int **)&PTR__FOptionMenuFieldBase_00b636a0;
  var_name = FName::operator_cast_to_char_
                       (&(this->super_FOptionMenuItem).super_FListMenuItem.mAction);
  pFVar1 = FindCVar(var_name,(FBaseCVar **)0x0);
  this->mCVar = pFVar1;
  if (local_28 != (char *)0x0) {
    sVar2 = strlen(local_28);
    if (sVar2 != 0) {
      local_88 = FindCVar(local_28,(FBaseCVar **)0x0);
      goto LAB_003e8b89;
    }
  }
  local_88 = (FBaseCVar *)0x0;
LAB_003e8b89:
  this->mGrayCheck = local_88;
  return;
}

Assistant:

FOptionMenuFieldBase ( const char* label, const char* menu, const char* graycheck ) :
		FOptionMenuItem ( label, menu ),
		mCVar ( FindCVar( mAction, NULL )),
		mGrayCheck (( graycheck && strlen( graycheck )) ? FindCVar( graycheck, NULL ) : NULL ) {}